

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommonCore.cpp
# Opt level: O1

void __thiscall helics::CommonCore::manageTimeBlocks(CommonCore *this,ActionMessage *command)

{
  int iVar1;
  pointer ppVar2;
  pair<helics::GlobalFederateId,_int> *block;
  pointer ppVar3;
  bool bVar4;
  pair<helics::GlobalFederateId,_int> *block_1;
  int local_24;
  
  if (command->messageAction == cmd_time_unblock) {
    ppVar2 = (this->timeBlocks).
             super__Vector_base<std::pair<helics::GlobalFederateId,_int>,_std::allocator<std::pair<helics::GlobalFederateId,_int>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (ppVar3 = (this->timeBlocks).
                  super__Vector_base<std::pair<helics::GlobalFederateId,_int>,_std::allocator<std::pair<helics::GlobalFederateId,_int>_>_>
                  ._M_impl.super__Vector_impl_data._M_start; ppVar3 != ppVar2; ppVar3 = ppVar3 + 1)
    {
      if (((command->source_id).gid == (ppVar3->first).gid) &&
         (iVar1 = ppVar3->second, ppVar3->second = iVar1 + -1, iVar1 < 2)) {
        ppVar3->second = 0;
        transmitDelayedMessages(this,(GlobalFederateId)(command->source_id).gid);
      }
    }
  }
  else if (command->messageAction == cmd_time_block) {
    ppVar3 = (this->timeBlocks).
             super__Vector_base<std::pair<helics::GlobalFederateId,_int>,_std::allocator<std::pair<helics::GlobalFederateId,_int>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    ppVar2 = (this->timeBlocks).
             super__Vector_base<std::pair<helics::GlobalFederateId,_int>,_std::allocator<std::pair<helics::GlobalFederateId,_int>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (ppVar3 != ppVar2) {
      iVar1 = (command->source_id).gid;
      bVar4 = false;
      do {
        if (iVar1 == (ppVar3->first).gid) {
          ppVar3->second = ppVar3->second + 1;
          bVar4 = true;
        }
        ppVar3 = ppVar3 + 1;
      } while (ppVar3 != ppVar2);
      if (bVar4) {
        return;
      }
    }
    std::
    vector<std::pair<helics::GlobalFederateId,int>,std::allocator<std::pair<helics::GlobalFederateId,int>>>
    ::emplace_back<helics::GlobalFederateId_const&,int>
              ((vector<std::pair<helics::GlobalFederateId,int>,std::allocator<std::pair<helics::GlobalFederateId,int>>>
                *)&this->timeBlocks,&command->source_id,&local_24);
  }
  return;
}

Assistant:

void CommonCore::manageTimeBlocks(const ActionMessage& command)
{
    if (command.action() == CMD_TIME_BLOCK) {
        bool found{false};
        for (auto& block : timeBlocks) {
            if (command.source_id == block.first) {
                ++block.second;
                found = true;
            }
        }
        if (!found) {
            timeBlocks.emplace_back(command.source_id, 1);
        }
    } else if (command.action() == CMD_TIME_UNBLOCK) {
        for (auto& block : timeBlocks) {
            if (command.source_id == block.first) {
                --block.second;
                if (block.second <= 0) {
                    block.second = 0;
                    transmitDelayedMessages(command.source_id);
                }
            }
        }
    }
}